

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::whileStmt(Parser *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  Lexer *pLVar4;
  long lVar5;
  undefined8 uVar6;
  Report *this_00;
  undefined4 uVar7;
  bool bVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer *__ptr;
  Parser *in_RSI;
  size_type __dnew;
  SourceLocation sloc;
  long *local_98;
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> local_90;
  undefined1 local_88 [32];
  __uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_> local_68;
  SourceLocation local_60;
  
  pLVar4 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  paVar2 = &local_60.filename.field_2;
  lVar5 = *(long *)&(pLVar4->location_).filename._M_dataplus;
  local_60.filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,lVar5,
             *(size_type *)((long)&(pLVar4->location_).filename + 8) + lVar5);
  uVar6 = *(undefined8 *)((long)&(pLVar4->location_).end + 4);
  local_60.end.column = (uint)uVar6;
  local_60.end.offset = (uint)((ulong)uVar6 >> 0x20);
  local_60.begin._0_8_ = *(undefined8 *)&(pLVar4->location_).begin;
  uVar6 = *(undefined8 *)((long)&(pLVar4->location_).begin + 8);
  local_60.begin.offset = (uint)uVar6;
  local_60.end.line = (uint)((ulong)uVar6 >> 0x20);
  bVar8 = expect(in_RSI,While);
  if (bVar8) {
    Lexer::nextToken((in_RSI->lexer_)._M_t.
                     super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                     .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl);
  }
  logicExpr((Parser *)&local_90);
  stmt((Parser *)&local_98);
  p_Var9 = (in_RSI->features_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var1 = &(in_RSI->features_)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = &p_Var1->_M_header;
    do {
      if (1 < (int)p_Var9[1]._M_color) {
        p_Var10 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 2];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color < 3)) goto LAB_0012ed42;
  }
  this_00 = in_RSI->report_;
  local_68._M_t.super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl =
       (tuple<flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)
       (_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>)0x1f;
  local_88._0_8_ = (_Base_ptr)(local_88 + 0x10);
  local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_68);
  local_88._16_8_ =
       local_68._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  builtin_strncpy((char *)((long)&((_Base_ptr)local_88._0_8_)->_M_parent + 7),"ure not ",8);
  builtin_strncpy((char *)((long)&((_Base_ptr)local_88._0_8_)->_M_left + 7),"enabled.",8);
  *(undefined8 *)local_88._0_8_ = 0x6f6c2d656c696857;
  ((_Base_ptr)local_88._0_8_)->_M_parent = (_Base_ptr)0x757461656620706f;
  local_88._8_8_ =
       local_68._M_t.
       super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
       super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  *(char *)((long)(Report **)
                  local_68._M_t.
                  super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>
                  .super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl +
           (long)&((_Base_ptr)local_88._0_8_)->_M_color) = '\0';
  diagnostics::Report::syntaxError<>(this_00,&local_60,(string *)local_88);
  if ((_Base_ptr)local_88._0_8_ != (_Base_ptr)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
  }
LAB_0012ed42:
  pLVar4 = (in_RSI->lexer_)._M_t.
           super___uniq_ptr_impl<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_>.
           super__Head_base<0UL,_flow::lang::Lexer_*,_false>._M_head_impl;
  local_60.end.offset = *(uint *)((long)&(pLVar4->lastLocation_).end + 8);
  uVar3 = (pLVar4->lastLocation_).end.line;
  uVar7 = (pLVar4->lastLocation_).end.column;
  local_60.end.line = uVar3;
  local_60.end.column = uVar7;
  std::
  make_unique<flow::lang::WhileStmt,flow::SourceLocation&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>>
            ((SourceLocation *)local_88,
             (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_60,
             &local_90);
  *(undefined8 *)&(this->features_)._M_t._M_impl = local_88._0_8_;
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 8))();
  }
  if (local_90._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
      _M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
      super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>)0x0) {
    (**(code **)(*(long *)local_90._M_t.
                          super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                          .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.filename._M_dataplus._M_p,
                    (ulong)(local_60.filename.field_2._M_allocated_capacity + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::whileStmt() {
  // whileStmt ::= 'while' expr stmt
  SourceLocation sloc(location());

  consume(Token::While);
  std::unique_ptr<Expr> cond = expr();
  std::unique_ptr<Stmt> body = stmt();

  if (!hasFeature(Feature::WhileLoop))
    report_.syntaxError(sloc, "While-loop feature not enabled.");

  return std::make_unique<WhileStmt>(sloc.update(end()), std::move(cond), std::move(body));
}